

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrReverseOrder(Vec_Ptr_t *p)

{
  void *pvVar1;
  int local_1c;
  int i;
  void *Temp;
  Vec_Ptr_t *p_local;
  
  for (local_1c = 0; local_1c < p->nSize / 2; local_1c = local_1c + 1) {
    pvVar1 = p->pArray[local_1c];
    p->pArray[local_1c] = p->pArray[(p->nSize + -1) - local_1c];
    p->pArray[(p->nSize + -1) - local_1c] = pvVar1;
  }
  return;
}

Assistant:

static inline void Vec_PtrReverseOrder( Vec_Ptr_t * p )
{
    void * Temp;
    int i;
    for ( i = 0; i < p->nSize/2; i++ )
    {
        Temp = p->pArray[i];
        p->pArray[i] = p->pArray[p->nSize-1-i];
        p->pArray[p->nSize-1-i] = Temp;
    }
}